

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O1

void phosg::make_fd_nonblocking(int fd)

{
  uint uVar1;
  int iVar2;
  runtime_error *prVar3;
  uint *puVar4;
  int error;
  int error_00;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  uVar1 = fcntl(fd,3,0);
  if ((int)uVar1 < 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    puVar4 = (uint *)__errno_location();
    string_for_error_abi_cxx11_(&sStack_58,(phosg *)(ulong)*puVar4,error);
    ::std::operator+(&local_38,"can\'t get socket flags: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sStack_58
                    );
    ::std::runtime_error::runtime_error(prVar3,(string *)&local_38);
    __cxa_throw(prVar3,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar2 = fcntl(fd,4,(ulong)(uVar1 | 0x800));
  if (-1 < iVar2) {
    return;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  puVar4 = (uint *)__errno_location();
  string_for_error_abi_cxx11_(&sStack_58,(phosg *)(ulong)*puVar4,error_00);
  ::std::operator+(&local_38,"can\'t set socket flags: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sStack_58);
  ::std::runtime_error::runtime_error(prVar3,(string *)&local_38);
  __cxa_throw(prVar3,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void make_fd_nonblocking(int fd) {
  int flags = fcntl(fd, F_GETFL, 0);
  if (flags < 0) {
    throw runtime_error("can\'t get socket flags: " + string_for_error(errno));
  }
  if (fcntl(fd, F_SETFL, flags | O_NONBLOCK) < 0) {
    throw runtime_error("can\'t set socket flags: " + string_for_error(errno));
  }
}